

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_3,_4> * __thiscall
tcu::transpose<float,4,3>
          (Matrix<float,_3,_4> *__return_storage_ptr__,tcu *this,Matrix<float,_4,_3> *mat)

{
  int row;
  long lVar1;
  Vector<float,_3> *pVVar2;
  long lVar3;
  
  Matrix<float,_3,_4>::Matrix(__return_storage_ptr__);
  pVVar2 = (Vector<float,_3> *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
      *(undefined4 *)
       ((long)((Vector<tcu::Vector<float,_3>,_4> *)pVVar2->m_data)->m_data[0].m_data + lVar3) =
           *(undefined4 *)(this + lVar3 * 4);
    }
    pVVar2 = pVVar2 + 1;
    this = this + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}